

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  pointer pcVar1;
  
  this->started_ = false;
  this->joined_ = false;
  this->pthreadId_ = 0;
  this->tid_ = 0;
  std::function<void_()>::function(&this->func_,func);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + n->_M_string_length);
  CountDownLatch::CountDownLatch(&this->latch_,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(const ThreadFunc& func, const string n)
        :started_(false), joined_(false), pthreadId_(0),
        tid_(0), func_(func), name_(n), latch_(1){
            setDefaultName();
}